

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O2

void __thiscall cppforth::Forth::flushFile(Forth *this)

{
  uint uVar1;
  allocator<char> local_51;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  string local_40 [32];
  
  requireDStackDepth(this,1,"FLUSH-FILE");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"FLUSH-FILE",&local_51);
  GetFileHandle((Forth *)&f,(Cell)this,(string *)(ulong)uVar1,(errorCodes)local_40);
  std::__cxx11::string::~string(local_40);
  std::ios::clear((int)f.
                       super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr +
                  (int)*(undefined8 *)
                        (*(long *)f.
                                  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + -0x18));
  std::ostream::flush();
  ForthStack<unsigned_int>::setTop
            (&this->dStack,
             -(*(uint *)(f.
                         super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr +
                        *(long *)(*(long *)f.
                                           super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + -0x18) + 0x20) & 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void flushFile() {
	REQUIRE_DSTACK_DEPTH(1, "FLUSH-FILE");
	auto h = (dStack.getTop());
	auto f = GetFileHandle(h, "FLUSH-FILE");
	f->clear();
	f->flush();
	auto status = f->rdstate();
	dStack.setTop(f->bad() ? Cell(-1) : 0);
}